

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::MultiVertexArrayStrideTests::init
          (MultiVertexArrayStrideTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int iVar1;
  Spec spec;
  Spec local_58;
  undefined8 local_30;
  undefined4 local_28;
  vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
  local_20;
  
  local_20.
  super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_20.
  super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20.
  super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30 = 0x10000000001;
  local_28 = 0;
  local_58.primitive = PRIMITIVE_TRIANGLES;
  local_58.drawCount = 0x100;
  local_58.first = 0;
  std::
  vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
  ::vector(&local_58.arrays,&local_20);
  addStrideCases(this,&local_58,3);
  iVar1 = extraout_EAX;
  if (local_58.arrays.
      super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.arrays.
                    super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.arrays.
                          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.arrays.
                          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar1 = extraout_EAX_00;
  }
  if (local_20.
      super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.
                    super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_20.
                          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.
                          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar1 = extraout_EAX_01;
  }
  return iVar1;
}

Assistant:

void MultiVertexArrayStrideTests::init (void)
{
	// Test different strides, with multiple arrays, input types??
	int arrayCounts[] = {3};

	MultiVertexArrayTest::Spec spec;

	spec.primitive	= Array::PRIMITIVE_TRIANGLES;
	spec.drawCount	= 256;
	spec.first		= 0;

	for (int arrayCountNdx = 0; arrayCountNdx < DE_LENGTH_OF_ARRAY(arrayCounts); arrayCountNdx++)
		addStrideCases(spec, arrayCounts[arrayCountNdx]);
}